

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QStyleOptionTitleBar * __thiscall QMdiSubWindowPrivate::titleBarOptions(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  Int IVar2;
  int aleft;
  QWidget *this_00;
  QStyle *pQVar3;
  QMdiSubWindowPrivate *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int width;
  int paintHeight;
  int border;
  QMdiSubWindow *q;
  QStyleOptionTitleBar *titleBarOptions;
  int in_stack_ffffffffffffff48;
  SubControl in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar4;
  int iVar5;
  QMdiSubWindowPrivate *this_01;
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  QFontMetrics local_38 [8];
  undefined8 local_30;
  undefined8 local_28;
  QFlagsStorageHelper<Qt::WindowState,_4> local_20;
  QFlagsStorageHelper<Qt::WindowType,_4> local_1c;
  Int local_18;
  Int local_14;
  Int local_10;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = &q_func(in_RSI)->super_QWidget;
  memset(this_01,0xaa,0x70);
  QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0x62f85a);
  QStyleOption::initFrom((QStyleOption *)this_01,(QWidget *)in_RDI);
  if (in_RSI->activeSubControl == SC_None) {
    bVar1 = autoRaise((QMdiSubWindowPrivate *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (((bVar1) && (in_RSI->hoveredSubControl != SC_None)) &&
       (in_RSI->hoveredSubControl != SC_TitleBarLabel)) {
      QFlags<QStyle::StateFlag>::operator|=
                ((State *)&(this_01->super_QWidgetPrivate).field_0x8,State_MouseOver);
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      (((SubControls *)&(this_01->super_QWidgetPrivate).field_0x44)->
      super_QFlagsStorageHelper<QStyle::SubControl,_4>).super_QFlagsStorage<QStyle::SubControl>.i =
           local_10;
    }
    else {
      QFlags<QStyle::StateFlag>::operator&=
                ((State *)&(this_01->super_QWidgetPrivate).field_0x8,-0x2001);
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      (((SubControls *)&(this_01->super_QWidgetPrivate).field_0x44)->
      super_QFlagsStorageHelper<QStyle::SubControl,_4>).super_QFlagsStorage<QStyle::SubControl>.i =
           local_14;
    }
  }
  else if (in_RSI->hoveredSubControl == in_RSI->activeSubControl) {
    QFlags<QStyle::StateFlag>::operator|=
              ((State *)&(this_01->super_QWidgetPrivate).field_0x8,State_Sunken);
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    (((SubControls *)&(this_01->super_QWidgetPrivate).field_0x44)->
    super_QFlagsStorageHelper<QStyle::SubControl,_4>).super_QFlagsStorage<QStyle::SubControl>.i =
         local_c;
  }
  QFlags<QStyle::SubControl>::QFlags
            ((QFlags<QStyle::SubControl> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
            );
  (((SubControls *)&(this_01->super_QWidgetPrivate).field_0x40)->
  super_QFlagsStorageHelper<QStyle::SubControl,_4>).super_QFlagsStorage<QStyle::SubControl>.i =
       local_18;
  local_1c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QWidget::windowFlags
                 ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  (((WindowFlags *)&(this_01->super_QWidgetPrivate).field_0x6c)->
  super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
       (Int)local_1c.super_QFlagsStorage<Qt::WindowType>.i;
  local_20.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       QWidget::windowState
                 ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
  *(Int *)&(this_01->super_QWidgetPrivate).field_0x68 = IVar2;
  QPalette::operator=((QPalette *)&(this_01->super_QWidgetPrivate).field_0x28,
                      (QPalette *)&in_RSI->titleBarPalette);
  QIcon::operator=((QIcon *)&(this_01->super_QWidgetPrivate).field_0x60,(QIcon *)&in_RSI->menuIcon);
  if ((in_RSI->isActive & 1U) == 0) {
    QFlags<QStyle::StateFlag>::operator&=
              ((State *)&(this_01->super_QWidgetPrivate).field_0x8,-0x10001);
    QPalette::setCurrentColorGroup((QPalette *)&(this_01->super_QWidgetPrivate).field_0x28,Inactive)
    ;
  }
  else {
    QFlags<QStyle::StateFlag>::operator|=
              ((State *)&(this_01->super_QWidgetPrivate).field_0x8,State_Active);
    *(uint *)&(this_01->super_QWidgetPrivate).field_0x68 =
         *(uint *)&(this_01->super_QWidgetPrivate).field_0x68 | 0x10000;
    QPalette::setCurrentColorGroup((QPalette *)&(this_01->super_QWidgetPrivate).field_0x28,Active);
  }
  bVar1 = hasBorder((QMdiSubWindowPrivate *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    (QStyleOptionTitleBar *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  aleft = 0;
  if (bVar1) {
    aleft = 4;
  }
  titleBarHeight(this_01,(QStyleOptionTitleBar *)in_RDI);
  bVar1 = QWidget::isMinimized(this_00);
  iVar5 = aleft;
  if (bVar1) {
    iVar5 = aleft << 1;
  }
  iVar4 = aleft;
  QWidget::width((QWidget *)0x62fae4);
  QRect::QRect((QRect *)CONCAT44(iVar5,iVar4),aleft,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  *(undefined8 *)&(this_01->super_QWidgetPrivate).field_0x10 = local_30;
  *(undefined8 *)&(this_01->super_QWidgetPrivate).field_0x18 = local_28;
  bVar1 = QString::isEmpty((QString *)0x62fb36);
  if (!bVar1) {
    QString::operator=((QString *)&(this_01->super_QWidgetPrivate).field_0x48,
                       (QString *)&in_RSI->windowTitle);
    QFontMetrics::QFontMetrics(local_38,&in_RSI->font);
    QFontMetrics::operator=
              ((QFontMetrics *)CONCAT44(aleft,in_stack_ffffffffffffff50),
               (QFontMetrics *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QFontMetrics::~QFontMetrics(local_38);
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                           );
    local_48 = (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,5,this_01,0x100,this_00);
    iVar5 = (int)this_01;
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QFontMetrics::elidedText((QString *)local_60,iVar5 + 0x20,(int)in_RSI + 0x3b8,1);
    QString::operator=((QString *)CONCAT44(aleft,in_stack_ffffffffffffff50),
                       (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QString::~QString((QString *)0x62fc1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStyleOptionTitleBar *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionTitleBar QMdiSubWindowPrivate::titleBarOptions() const
{
    Q_Q(const QMdiSubWindow);
    QStyleOptionTitleBar titleBarOptions;
    titleBarOptions.initFrom(q);
    if (activeSubControl != QStyle::SC_None) {
        if (hoveredSubControl == activeSubControl) {
            titleBarOptions.state |= QStyle::State_Sunken;
            titleBarOptions.activeSubControls = activeSubControl;
        }
    } else if (autoRaise() && hoveredSubControl != QStyle::SC_None
               && hoveredSubControl != QStyle::SC_TitleBarLabel) {
        titleBarOptions.state |= QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = hoveredSubControl;
    } else {
        titleBarOptions.state &= ~QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = QStyle::SC_None;
    }

    titleBarOptions.subControls = QStyle::SC_All;
    titleBarOptions.titleBarFlags = q->windowFlags();
    titleBarOptions.titleBarState = q->windowState();
    titleBarOptions.palette = titleBarPalette;
    titleBarOptions.icon = menuIcon;

    if (isActive) {
        titleBarOptions.state |= QStyle::State_Active;
        titleBarOptions.titleBarState |= QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Active);
    } else {
        titleBarOptions.state &= ~QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Inactive);
    }

    int border = hasBorder(titleBarOptions) ? 4 : 0;
    int paintHeight = titleBarHeight(titleBarOptions);
    paintHeight -= q->isMinimized() ? 2 * border : border;
    titleBarOptions.rect = QRect(border, border, q->width() - 2 * border, paintHeight);

    if (!windowTitle.isEmpty()) {
        // Set the text here before asking for the width of the title bar label
        // in case people uses the actual text to calculate the width.
        titleBarOptions.text = windowTitle;
        titleBarOptions.fontMetrics = QFontMetrics(font);
        int width = q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                                               QStyle::SC_TitleBarLabel, q).width();
        // Set elided text if we don't have enough space for the entire title.
        titleBarOptions.text = titleBarOptions.fontMetrics.elidedText(windowTitle, Qt::ElideRight, width);
    }
    return titleBarOptions;
}